

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_replace(lua_State *L,int idx)

{
  GCObject *o_00;
  StkId pTVar1;
  TValue *pTVar2;
  TValue *o1;
  TValue *o2;
  Closure *func;
  StkId o;
  int idx_local;
  lua_State *L_local;
  
  if ((idx == -0x2711) && (L->ci == L->base_ci)) {
    luaG_runerror(L,"no calling environment");
  }
  pTVar2 = index2adr(L,idx);
  if (idx == -0x2711) {
    o_00 = (L->ci->func->value).gc;
    (o_00->h).array = (TValue *)L->top[-1].value;
    if (((3 < L->top[-1].tt) && ((((L->top[-1].value.gc)->gch).marked & 3) != 0)) &&
       (((o_00->gch).marked & 4) != 0)) {
      luaC_barrierf(L,o_00,L->top[-1].value.gc);
    }
  }
  else {
    pTVar1 = L->top;
    pTVar2->value = pTVar1[-1].value;
    pTVar2->tt = pTVar1[-1].tt;
    if ((((idx < -0x2712) && (3 < L->top[-1].tt)) &&
        ((((L->top[-1].value.gc)->gch).marked & 3) != 0)) &&
       (((((L->ci->func->value).gc)->gch).marked & 4) != 0)) {
      luaC_barrierf(L,(L->ci->func->value).gc,L->top[-1].value.gc);
    }
  }
  L->top = L->top + -1;
  return;
}

Assistant:

LUA_API void lua_replace (lua_State *L, int idx) {
  StkId o;
  lua_lock(L);
  /* explicit test for incompatible code */
  if (idx == LUA_ENVIRONINDEX && L->ci == L->base_ci)
    luaG_runerror(L, "no calling environment");
  api_checknelems(L, 1);
  o = index2adr(L, idx);
  api_checkvalidindex(L, o);
  if (idx == LUA_ENVIRONINDEX) {
    Closure *func = curr_func(L);
    api_check(L, ttistable(L->top - 1)); 
    func->c.env = hvalue(L->top - 1);
    luaC_barrier(L, func, L->top - 1);
  }
  else {
    setobj(L, o, L->top - 1);
    if (idx < LUA_GLOBALSINDEX)  /* function upvalue? */
      luaC_barrier(L, curr_func(L), L->top - 1);
  }
  L->top--;
  lua_unlock(L);
}